

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O0

mz_uint mz_zip_reader_get_filename
                  (mz_zip_archive *pZip,mz_uint file_index,char *pFilename,mz_uint filename_buf_size
                  )

{
  uint local_4c;
  mz_uint8 *p;
  mz_uint n;
  mz_uint filename_buf_size_local;
  char *pFilename_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  long local_10;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    local_10 = 0;
  }
  else {
    local_10 = (long)(pZip->m_pState->m_central_dir).m_p +
               (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p +
                               (ulong)file_index * 4);
  }
  if (local_10 == 0) {
    if (filename_buf_size != 0) {
      *pFilename = '\0';
    }
    pZip_local._0_4_ = 0;
  }
  else {
    local_4c = (uint)*(ushort *)(local_10 + 0x1c);
    p._0_4_ = local_4c;
    if (filename_buf_size != 0) {
      if (filename_buf_size - 1 <= local_4c) {
        local_4c = filename_buf_size - 1;
      }
      p._0_4_ = local_4c;
      memcpy(pFilename,(void *)(local_10 + 0x2e),(ulong)local_4c);
      pFilename[local_4c] = '\0';
    }
    pZip_local._0_4_ = (uint)p + 1;
  }
  return (mz_uint)pZip_local;
}

Assistant:

mz_uint mz_zip_reader_get_filename(mz_zip_archive *pZip, mz_uint file_index, char *pFilename, mz_uint filename_buf_size)
{
    mz_uint n;
    const mz_uint8 *p = mz_zip_get_cdh(pZip, file_index);
    if (!p)
    {
        if (filename_buf_size)
            pFilename[0] = '\0';
        mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
        return 0;
    }
    n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    if (filename_buf_size)
    {
        n = MZ_MIN(n, filename_buf_size - 1);
        memcpy(pFilename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
        pFilename[n] = '\0';
    }
    return n + 1;
}